

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_div_mips64el(float128 a,float128 b,float_status *status)

{
  uint32_t bLow;
  ulong uVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t aLow;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  float128 fVar18;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t bExp;
  int32_t aExp;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t local_90;
  ulong local_88;
  int32_t local_7c;
  uint local_78;
  uint local_74;
  ulong local_70;
  float_status *local_68;
  uint64_t local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_60 = b.low;
  uVar2 = a.low;
  uVar16 = a.high & 0xffffffffffff;
  local_74 = a.high._6_2_ & 0x7fff;
  local_58 = b.high & 0xffffffffffff;
  local_78 = b.high._6_2_ & 0x7fff;
  uVar7 = b.high ^ a.high;
  local_90 = uVar2;
  local_88 = uVar16;
  if (local_74 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar2 != 0) {
LAB_00930c77:
      fVar18 = propagateFloat128NaN(a,b,status);
      return fVar18;
    }
    if (local_78 != 0x7fff) {
LAB_00930e4b:
      uVar7 = uVar7 & 0x8000000000000000 | 0x7fff000000000000;
      uVar2 = 0;
      goto LAB_009312ac;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_60 != 0) goto LAB_00930c77;
LAB_00930e6c:
    status->float_exception_flags = status->float_exception_flags | 1;
    uVar7 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar7 = 0x1fffffffffffffff;
    }
    uVar2 = -(ulong)((uint)uVar7 & 1);
    uVar7 = uVar7 >> 0xe | 0x7fff000000000000;
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_60 == 0) {
        if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0
            || uVar2 != 0) ||
            ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0) {
          status->float_exception_flags = status->float_exception_flags | 4;
          goto LAB_00930e4b;
        }
        goto LAB_00930e6c;
      }
      normalizeFloat128Subnormal(local_58,local_60,(int32_t *)&local_78,&local_58,&local_60);
LAB_00930cb6:
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_00930cea:
        uVar16 = local_90 << 0xf;
        local_88 = local_88 << 0xf | local_90 >> 0x31 | 0x8000000000000000;
        uVar12 = local_60 * 0x8000;
        uVar9 = local_58 << 0xf;
        local_70 = uVar9 | 0x8000000000000000;
        local_50 = local_60 >> 0x31;
        local_58 = local_50 | local_70;
        if ((local_58 < local_88) || (uVar12 <= uVar16 && local_58 == local_88)) {
          local_90 = (local_90 >> 0x31) << 0x3f | uVar16 >> 1;
          local_88 = local_88 >> 1;
          local_7c = (local_74 - local_78) + 0x3ffe;
        }
        else {
          local_7c = (local_74 - local_78) + 0x3ffd;
          local_90 = uVar16;
        }
        uVar16 = 0xffffffffffffffff;
        if (local_88 < local_58) {
          uVar10 = local_70 >> 0x20;
          uVar5 = uVar9 & 0xffffffff00000000 | 0x8000000000000000;
          uVar11 = 0xffffffff00000000;
          if (local_88 < uVar5) {
            uVar11 = local_88 / uVar10 << 0x20;
          }
          uVar13 = (local_50 | uVar9 & 0xffffffff) * (uVar11 >> 0x20);
          uVar1 = uVar11 * local_58;
          uVar16 = local_90 - uVar1;
          lVar3 = ((local_88 - ((uVar13 >> 0x20) + (uVar11 >> 0x20) * uVar10)) -
                  (ulong)(local_90 < uVar1)) - (ulong)(uVar1 < uVar13 << 0x20);
          if (lVar3 < 0) {
            uVar1 = (0x100000000 - uVar11) * local_58 + local_90;
            uVar13 = uVar16;
            do {
              uVar11 = uVar11 - 0x100000000;
              uVar16 = uVar13 + (local_58 << 0x20);
              bVar17 = uVar1 < uVar13;
              uVar1 = uVar1 + (local_58 << 0x20);
              lVar3 = lVar3 + uVar10 + (ulong)bVar17;
              uVar13 = uVar16;
            } while (lVar3 < 0);
          }
          uVar16 = uVar16 >> 0x20 | lVar3 << 0x20;
          if (uVar16 < uVar5) {
            uVar16 = uVar16 / uVar10;
          }
          else {
            uVar16 = 0xffffffff;
          }
          uVar16 = uVar16 | uVar11;
        }
        local_40 = uVar12 >> 0x20;
        uVar5 = uVar16 >> 0x20;
        local_48 = uVar12 & 0xffffffff;
        uVar10 = (uVar16 & 0xffffffff) * local_40;
        uVar11 = uVar10 + uVar5 * local_48;
        local_38 = 0;
        if (CARRY8(uVar10,uVar5 * local_48)) {
          local_38 = 0x100000000;
        }
        uVar10 = uVar16 * uVar12;
        local_70 = local_70 >> 0x20;
        local_50 = local_50 | uVar9 & 0xffffffff;
        uVar1 = (uVar16 & 0xffffffff) * local_70;
        uVar13 = uVar1 + uVar5 * local_50;
        lVar3 = 0;
        if (CARRY8(uVar1,uVar5 * local_50)) {
          lVar3 = -0x100000000;
        }
        uVar6 = uVar16 * local_58;
        uVar4 = uVar5 * local_40 + uVar6 + (uVar11 >> 0x20) + local_38 +
                (ulong)(uVar10 < uVar11 << 0x20);
        uVar11 = -uVar10;
        uVar1 = (local_90 - uVar4) - (ulong)(uVar10 != 0);
        lVar3 = (((((local_88 - ((uVar13 >> 0x20) + uVar5 * local_70)) + lVar3) -
                  (ulong)(uVar6 < uVar13 << 0x20)) - (ulong)(uVar4 < uVar6)) -
                (ulong)(local_90 < uVar4)) - (ulong)(local_90 - uVar4 < (ulong)(uVar10 != 0));
        if (lVar3 < 0) {
          uVar5 = (uVar16 * -0x8000 + 0x8000) * local_60;
          do {
            uVar16 = uVar16 - 1;
            bVar17 = CARRY8(uVar1,local_58);
            uVar10 = uVar1 + local_58;
            uVar1 = uVar10 + (uVar5 < uVar11);
            lVar3 = lVar3 + (ulong)bVar17 + (ulong)CARRY8(uVar10,(ulong)(uVar5 < uVar11));
            uVar11 = uVar11 + uVar12;
            uVar5 = uVar5 + uVar12;
          } while (lVar3 < 0);
        }
        uVar5 = 0xffffffffffffffff;
        if (uVar1 < local_58) {
          uVar10 = 0xffffffff00000000;
          uVar9 = uVar9 & 0xffffffff00000000 | 0x8000000000000000;
          if (uVar1 < uVar9) {
            uVar10 = uVar1 / local_70 << 0x20;
          }
          uVar4 = (uVar10 >> 0x20) * local_50;
          uVar13 = uVar10 * local_58;
          uVar5 = uVar11 - uVar13;
          lVar3 = ((uVar1 - ((uVar4 >> 0x20) + (uVar10 >> 0x20) * local_70)) -
                  (ulong)(uVar11 < uVar13)) - (ulong)(uVar13 < uVar4 << 0x20);
          if (lVar3 < 0) {
            uVar13 = (0x100000000 - uVar10) * local_58 + uVar11;
            uVar4 = uVar5;
            do {
              uVar10 = uVar10 - 0x100000000;
              uVar5 = uVar4 + (local_58 << 0x20);
              bVar17 = uVar13 < uVar4;
              uVar13 = uVar13 + (local_58 << 0x20);
              lVar3 = lVar3 + local_70 + (ulong)bVar17;
              uVar4 = uVar5;
            } while (lVar3 < 0);
          }
          uVar5 = uVar5 >> 0x20 | lVar3 << 0x20;
          if (uVar5 < uVar9) {
            uVar5 = uVar5 / local_70;
          }
          else {
            uVar5 = 0xffffffff;
          }
          uVar5 = uVar5 | uVar10;
        }
        if (((uint)uVar5 & 0x3fff) < 5) {
          uVar13 = uVar5 >> 0x20;
          uVar9 = (uVar5 & 0xffffffff) * local_40;
          uVar10 = uVar9 + local_48 * uVar13;
          lVar3 = 0x100000000;
          if (!CARRY8(uVar9,local_48 * uVar13)) {
            lVar3 = 0;
          }
          uVar4 = (uVar5 & 0xffffffff) * local_70;
          uVar9 = uVar5 * uVar12;
          uVar6 = uVar4 + local_50 * uVar13;
          lVar8 = -0x100000000;
          if (!CARRY8(uVar4,local_50 * uVar13)) {
            lVar8 = 0;
          }
          uVar4 = uVar5 * local_58;
          uVar15 = local_40 * uVar13 + uVar4 + (uVar10 >> 0x20) + lVar3 +
                   (ulong)(uVar9 < uVar10 << 0x20);
          uVar10 = -uVar9;
          uVar14 = (uVar11 - uVar15) - (ulong)(uVar9 != 0);
          lVar3 = (((((uVar1 - ((uVar6 >> 0x20) + uVar13 * local_70)) + lVar8) -
                    (ulong)(uVar4 < uVar6 << 0x20)) - (ulong)(uVar15 < uVar4)) -
                  (ulong)(uVar11 < uVar15)) - (ulong)(uVar11 - uVar15 < (ulong)(uVar9 != 0));
          if (lVar3 < 0) {
            local_60 = local_60 * (uVar5 * -0x8000 + 0x8000);
            do {
              uVar5 = uVar5 - 1;
              bVar17 = CARRY8(uVar14,local_58);
              uVar9 = uVar14 + local_58;
              uVar14 = uVar9 + (local_60 < uVar10);
              lVar3 = lVar3 + (ulong)bVar17 + (ulong)CARRY8(uVar9,(ulong)(local_60 < uVar10));
              uVar10 = uVar10 + uVar12;
              local_60 = local_60 + uVar12;
            } while (lVar3 < 0);
          }
          uVar5 = uVar5 | ((lVar3 != 0 || uVar14 != 0) || uVar10 != 0);
        }
        local_68 = status;
        local_60 = uVar12;
        fVar18 = roundAndPackFloat128
                           ((byte)(uVar7 >> 0x3f),local_7c,uVar16 >> 0xf,
                            uVar16 << 0x31 | uVar5 >> 0xf,uVar5 << 0x31,status);
        return fVar18;
      }
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          uVar2 != 0) {
        normalizeFloat128Subnormal(uVar16,uVar2,(int32_t *)&local_74,&local_88,&local_90);
        goto LAB_00930cea;
      }
    }
    else {
      if (local_78 != 0x7fff) goto LAB_00930cb6;
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
          local_60 != 0) goto LAB_00930c77;
    }
    uVar7 = uVar7 & 0x8000000000000000;
    uVar2 = 0;
  }
LAB_009312ac:
  fVar18.high = uVar7;
  fVar18.low = uVar2;
  return fVar18;
}

Assistant:

float128 float128_div(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign, 0, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
            if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return float128_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = aExp - bExp + 0x3FFD;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000), aSig1, 15, &aSig0, &aSig1 );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    if ( le128( bSig0, bSig1, aSig0, aSig1 ) ) {
        shift128Right( aSig0, aSig1, 1, &aSig0, &aSig1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig0, aSig1, bSig0 );
    mul128By64To192( bSig0, bSig1, zSig0, &term0, &term1, &term2 );
    sub192( aSig0, aSig1, 0, term0, term1, term2, &rem0, &rem1, &rem2 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add192( rem0, rem1, rem2, 0, bSig0, bSig1, &rem0, &rem1, &rem2 );
    }
    zSig1 = estimateDiv128To64( rem1, rem2, bSig0 );
    if ( ( zSig1 & 0x3FFF ) <= 4 ) {
        mul128By64To192( bSig0, bSig1, zSig1, &term1, &term2, &term3 );
        sub192( rem1, rem2, 0, term1, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add192( rem1, rem2, rem3, 0, bSig0, bSig1, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 15, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}